

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_start(fio_start_args args)

{
  fio_data_s *pfVar1;
  fio_lock_i fVar2;
  int iVar3;
  char *pcVar4;
  int i;
  sigaction *__act;
  char *arg1;
  char *pcVar5;
  undefined1 auVar6 [16];
  fio_start_args args_local;
  fio_lock_i ret;
  undefined7 uStack_9f;
  sigset_t local_98;
  int local_18;
  
  __act = (sigaction *)&args_local.workers;
  args_local = args;
  fio_expected_concurrency(&args_local.threads,(int16_t *)__act);
  fVar2 = fio_signal_set_flag;
  LOCK();
  fio_signal_set_flag = '\x01';
  UNLOCK();
  ret = fVar2;
  if (fVar2 == '\0') {
    memset(&local_98,0,0x90);
    _ret = sig_int_handler;
    sigemptyset(&local_98);
    local_18 = 0x10000001;
    __act = (sigaction *)&ret;
    iVar3 = sigaction(2,__act,(sigaction *)&fio_old_sig_int);
    if (iVar3 == 0) {
      __act = (sigaction *)&ret;
      iVar3 = sigaction(0xf,__act,(sigaction *)&fio_old_sig_term);
      if (iVar3 == 0) {
        __act = (sigaction *)&ret;
        iVar3 = sigaction(10,__act,(sigaction *)&fio_old_sig_usr1);
        if (iVar3 == 0) {
          __act = (sigaction *)&ret;
          _ret = (code *)0x1;
          iVar3 = sigaction(0xd,__act,(sigaction *)&fio_old_sig_pipe);
          if (iVar3 == 0) goto LAB_0012f148;
        }
      }
    }
    perror("couldn\'t set signal handler");
  }
LAB_0012f148:
  pfVar1 = fio_data;
  auVar6 = pshuflw(ZEXT416((uint)args_local),ZEXT416((uint)args_local),0xe1);
  pfVar1->workers = (short)auVar6._0_4_;
  pfVar1->threads = (short)((uint)auVar6._0_4_ >> 0x10);
  pfVar1->active = '\x01';
  pfVar1->is_worker = '\0';
  arg1 = &DAT_00000001;
  fio_state_callback_force(FIO_CALL_PRE_START);
  if (3 < FIO_LOG_LEVEL) {
    __act = (sigaction *)(ulong)fio_data->workers;
    pcVar4 = "worker";
    if (1 < fio_data->workers) {
      pcVar4 = "workers";
    }
    pcVar5 = "thread";
    if (1 < fio_data->threads) {
      pcVar5 = "threads";
    }
    arg1 = 
    "INFO: Server is running %u %s X %u %s with facil.io 0.7.3 (%s)\n* Detected capacity: %d open file limit\n* Root pid: %d\n* Press ^C to stop\n"
    ;
    FIO_LOG2STDERR("INFO: Server is running %u %s X %u %s with facil.io 0.7.3 (%s)\n* Detected capacity: %d open file limit\n* Root pid: %d\n* Press ^C to stop\n"
                   ,__act,pcVar4,(ulong)fio_data->threads,pcVar5,"epoll",(ulong)fio_data->capa,
                   (ulong)(uint)fio_data->parent);
  }
  if (1 < args_local.workers) {
    iVar3 = 0;
    do {
      if (fio_data->active == '\0') break;
      fio_sentinel_task(arg1,__act);
      iVar3 = iVar3 + 1;
    } while (iVar3 < args_local.workers);
  }
  fio_worker_startup();
  fio_worker_cleanup();
  return;
}

Assistant:

void fio_start FIO_IGNORE_MACRO(struct fio_start_args args) {
  fio_expected_concurrency(&args.threads, &args.workers);
  fio_signal_handler_setup();

  fio_data->workers = (uint16_t)args.workers;
  fio_data->threads = (uint16_t)args.threads;
  fio_data->active = 1;
  fio_data->is_worker = 0;

  fio_state_callback_force(FIO_CALL_PRE_START);

  FIO_LOG_INFO(
      "Server is running %u %s X %u %s with facil.io " FIO_VERSION_STRING
      " (%s)\n"
      "* Detected capacity: %d open file limit\n"
      "* Root pid: %d\n"
      "* Press ^C to stop\n",
      fio_data->workers, fio_data->workers > 1 ? "workers" : "worker",
      fio_data->threads, fio_data->threads > 1 ? "threads" : "thread",
      fio_engine(), fio_data->capa, (int)fio_data->parent);

  if (args.workers > 1) {
    for (int i = 0; i < args.workers && fio_data->active; ++i) {
      fio_sentinel_task(NULL, NULL);
    }
  }
  fio_worker_startup();
  fio_worker_cleanup();
}